

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O3

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::async_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
               *this)

{
  scgi *__p;
  shared_ptr<cppcms::impl::cgi::scgi> api;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (this->stopped_ == false) {
    __p = server_api_factory<cppcms::impl::cgi::scgi>::operator()
                    ((server_api_factory<cppcms::impl::cgi::scgi> *)&this->field_0x64,this->srv_);
    std::__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::scgi,void>
              ((__shared_ptr<cppcms::impl::cgi::scgi,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p);
    (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_28;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->api_).
                super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_20);
    this->asio_socket_ = (stream_socket *)&local_28[1].pool_;
    booster::callback<void(std::error_code_const&)>::
    callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::scgi,cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>>::accept_binder>
              ((callback<void(std::error_code_const&)> *)&local_30,(accept_binder)this);
    booster::aio::acceptor::async_accept
              ((stream_socket *)&this->acceptor_,(callback *)&local_28[1].pool_);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_30);
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  return;
}

Assistant:

virtual void async_accept()
			{
				if(stopped_)
					return;
				booster::shared_ptr<ServerAPI> api(factory_(srv_));
				api_=api;
				asio_socket_ = &api->socket_;
				acceptor_.async_accept(*asio_socket_,accept_binder(this));
			}